

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall
HighsSimplexAnalysis::updateInvertFormData(HighsSimplexAnalysis *this,HFactor *factor)

{
  double *pdVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  double kMajorKernelRelativeDimThreshold;
  double kernel_fill_factor;
  HighsInt kernel_invert_num_el;
  double kernel_relative_dim;
  double invert_fill_factor;
  bool report_kernel;
  double local_28;
  double local_20;
  undefined1 local_11;
  long local_10;
  
  local_11 = 0;
  *(int *)(in_RDI + 0x9e8) = *(int *)(in_RDI + 0x9e8) + 1;
  local_20 = ((double)*(int *)(in_RSI + 0xbc) * 1.0) / (double)*(int *)(in_RSI + 0xb8);
  *(double *)(in_RDI + 0xa10) = local_20 + *(double *)(in_RDI + 0xa10);
  *(double *)(in_RDI + 0xa28) = *(double *)(in_RDI + 0xa28) * 0.95 + local_20 * 0.05;
  local_28 = ((double)*(int *)(in_RSI + 0xc0) * 1.0) / (double)*(int *)(in_RDI + 0x40);
  if (*(int *)(in_RSI + 0xc0) != 0) {
    *(int *)(in_RDI + 0x9ec) = *(int *)(in_RDI + 0x9ec) + 1;
    local_10 = in_RSI;
    pdVar1 = std::max<double>(&local_28,(double *)(in_RDI + 0x9f8));
    *(double *)(in_RDI + 0x9f8) = *pdVar1;
    *(double *)(in_RDI + 0xa00) = local_28 + *(double *)(in_RDI + 0xa00);
    *(double *)(in_RDI + 0xa08) = *(double *)(in_RDI + 0xa08) * 0.95 + local_28 * 0.05;
    dVar2 = ((double)(*(int *)(local_10 + 0xbc) -
                     (*(int *)(local_10 + 0xb8) - *(int *)(local_10 + 0xc4))) * 1.0) /
            (double)*(int *)(local_10 + 0xc4);
    *(double *)(in_RDI + 0xa18) = dVar2 + *(double *)(in_RDI + 0xa18);
    *(double *)(in_RDI + 0xa30) = *(double *)(in_RDI + 0xa30) * 0.95 + dVar2 * 0.05;
    if (0.1 < local_28) {
      *(int *)(in_RDI + 0x9f0) = *(int *)(in_RDI + 0x9f0) + 1;
      *(double *)(in_RDI + 0xa20) = dVar2 + *(double *)(in_RDI + 0xa20);
      *(double *)(in_RDI + 0xa38) = *(double *)(in_RDI + 0xa38) * 0.95 + dVar2 * 0.05;
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::updateInvertFormData(const HFactor& factor) {
  assert(analyse_factor_data);
  const bool report_kernel = false;
  num_invert++;
  assert(factor.basis_matrix_num_el);
  double invert_fill_factor =
      ((1.0 * factor.invert_num_el) / factor.basis_matrix_num_el);
  if (report_kernel) printf("INVERT fill = %6.2f", invert_fill_factor);
  sum_invert_fill_factor += invert_fill_factor;
  running_average_invert_fill_factor =
      0.95 * running_average_invert_fill_factor + 0.05 * invert_fill_factor;

  double kernel_relative_dim = (1.0 * factor.kernel_dim) / numRow;
  if (report_kernel) printf("; kernel dim = %11.4g", kernel_relative_dim);
  if (factor.kernel_dim) {
    num_kernel++;
    max_kernel_dim = max(kernel_relative_dim, max_kernel_dim);
    sum_kernel_dim += kernel_relative_dim;
    running_average_kernel_dim =
        0.95 * running_average_kernel_dim + 0.05 * kernel_relative_dim;

    HighsInt kernel_invert_num_el =
        factor.invert_num_el -
        (factor.basis_matrix_num_el - factor.kernel_num_el);
    assert(factor.kernel_num_el);
    double kernel_fill_factor =
        (1.0 * kernel_invert_num_el) / factor.kernel_num_el;
    sum_kernel_fill_factor += kernel_fill_factor;
    running_average_kernel_fill_factor =
        0.95 * running_average_kernel_fill_factor + 0.05 * kernel_fill_factor;
    if (report_kernel) printf("; fill = %6.2f", kernel_fill_factor);
    const double kMajorKernelRelativeDimThreshold = 0.1;
    if (kernel_relative_dim > kMajorKernelRelativeDimThreshold) {
      num_major_kernel++;
      sum_major_kernel_fill_factor += kernel_fill_factor;
      running_average_major_kernel_fill_factor =
          0.95 * running_average_major_kernel_fill_factor +
          0.05 * kernel_fill_factor;
    }
  }
  if (report_kernel) printf("\n");
}